

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

void __thiscall
spvtools::opt::CopyPropagateArrays::PropagateObject
          (CopyPropagateArrays *this,Instruction *var_inst,MemoryObject *source,
          Instruction *insertion_point)

{
  Instruction *new_ptr_inst;
  
  if (var_inst->opcode_ == OpVariable) {
    new_ptr_inst = BuildNewAccessChain(this,insertion_point,source);
    IRContext::KillNamesAndDecorates((this->super_MemPass).super_Pass.context_,var_inst);
    UpdateUses(this,var_inst,new_ptr_inst);
    return;
  }
  __assert_fail("var_inst->opcode() == spv::Op::OpVariable && \"This function propagates variables.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                ,0xaf,
                "void spvtools::opt::CopyPropagateArrays::PropagateObject(Instruction *, MemoryObject *, Instruction *)"
               );
}

Assistant:

void CopyPropagateArrays::PropagateObject(Instruction* var_inst,
                                          MemoryObject* source,
                                          Instruction* insertion_point) {
  assert(var_inst->opcode() == spv::Op::OpVariable &&
         "This function propagates variables.");

  Instruction* new_access_chain = BuildNewAccessChain(insertion_point, source);
  context()->KillNamesAndDecorates(var_inst);
  UpdateUses(var_inst, new_access_chain);
}